

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O2

int __thiscall ncnn::Convolution_x86::destroy_pipeline(Convolution_x86 *this,Option *opt)

{
  if (this->activation != (Layer *)0x0) {
    (*this->activation->_vptr_Layer[5])();
    if (this->activation != (Layer *)0x0) {
      (*this->activation->_vptr_Layer[1])();
    }
    this->activation = (Layer *)0x0;
  }
  return 0;
}

Assistant:

int Convolution_x86::destroy_pipeline(const Option& opt)
{
    if (activation)
    {
        activation->destroy_pipeline(opt);
        delete activation;
        activation = 0;
    }

    return 0;
}